

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_testFailureWithQuotesInIt_Test::
TEST_JUnitOutputTest_testFailureWithQuotesInIt_Test
          (TEST_JUnitOutputTest_testFailureWithQuotesInIt_Test *this)

{
  TEST_JUnitOutputTest_testFailureWithQuotesInIt_Test *this_local;
  
  memset(this,0,0x28);
  TEST_GROUP_CppUTestGroupJUnitOutputTest::TEST_GROUP_CppUTestGroupJUnitOutputTest
            (&this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest);
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_JUnitOutputTest_testFailureWithQuotesInIt_Test_003d12c8;
  return;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithQuotesInIt)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("Test \"failed\"", "thisfile", 10)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"thisfile:10: Test &quot;failed&quot;\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}